

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O1

OPJ_UINT32 opj_tgt_decode(opj_bio_t *bio,opj_tgt_tree_t *tree,OPJ_UINT32 leafno,OPJ_INT32 threshold)

{
  opj_tgt_node *poVar1;
  int iVar2;
  OPJ_UINT32 OVar3;
  int iVar4;
  long *plVar5;
  opj_tgt_node_t *poVar6;
  opj_tgt_node_t *stk [31];
  long local_128 [31];
  
  plVar5 = local_128;
  poVar6 = tree->nodes + leafno;
  poVar1 = poVar6->parent;
  while (poVar1 != (opj_tgt_node *)0x0) {
    *plVar5 = (long)poVar6;
    plVar5 = plVar5 + 1;
    poVar6 = poVar6->parent;
    poVar1 = poVar6->parent;
  }
  iVar2 = 0;
  while( true ) {
    iVar4 = poVar6->low;
    if (poVar6->low < iVar2) {
      poVar6->low = iVar2;
      iVar4 = iVar2;
    }
    while ((iVar4 < threshold && (iVar4 < poVar6->value))) {
      OVar3 = opj_bio_read(bio,1);
      if (OVar3 == 0) {
        iVar4 = iVar4 + 1;
      }
      else {
        poVar6->value = iVar4;
      }
    }
    poVar6->low = iVar4;
    if (plVar5 == local_128) break;
    poVar6 = (opj_tgt_node_t *)plVar5[-1];
    plVar5 = plVar5 + -1;
    iVar2 = iVar4;
  }
  return (uint)(poVar6->value < threshold);
}

Assistant:

OPJ_UINT32 opj_tgt_decode(opj_bio_t *bio, opj_tgt_tree_t *tree,
                          OPJ_UINT32 leafno, OPJ_INT32 threshold)
{
    opj_tgt_node_t *stk[31];
    opj_tgt_node_t **stkptr;
    opj_tgt_node_t *node;
    OPJ_INT32 low;

    stkptr = stk;
    node = &tree->nodes[leafno];
    while (node->parent) {
        *stkptr++ = node;
        node = node->parent;
    }

    low = 0;
    for (;;) {
        if (low > node->low) {
            node->low = low;
        } else {
            low = node->low;
        }
        while (low < threshold && low < node->value) {
            if (opj_bio_read(bio, 1)) {
                node->value = low;
            } else {
                ++low;
            }
        }
        node->low = low;
        if (stkptr == stk) {
            break;
        }
        node = *--stkptr;
    }

    return (node->value < threshold) ? 1 : 0;
}